

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scratch_impl.h
# Opt level: O1

void secp256k1_scratch_destroy(secp256k1_callback *error_callback,secp256k1_scratch *scratch)

{
  undefined8 uVar1;
  void *pvVar2;
  long lVar3;
  int iVar4;
  undefined4 uVar5;
  secp256k1_callback sVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  
  if (scratch == (secp256k1_scratch *)0x0) {
    return;
  }
  lVar3 = 0;
  do {
    iVar4 = (uint)scratch->magic[lVar3] - (uint)(byte)"scratch"[lVar3];
    if (scratch->magic[lVar3] != "scratch"[lVar3]) goto LAB_0014ac77;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 8);
  iVar4 = 0;
LAB_0014ac77:
  if (iVar4 != 0) {
    (*error_callback->fn)("invalid scratch space",error_callback->data);
    return;
  }
  if (scratch->alloc_size != 0) {
    secp256k1_scratch_destroy_cold_1();
    pvVar2 = scratch->data;
    uVar1 = *(undefined8 *)scratch->magic;
    auVar7._0_4_ = (int)(short)uVar1;
    auVar7._4_4_ = (int)(short)((ulong)uVar1 >> 0x10);
    auVar7._8_4_ = (int)(short)((ulong)uVar1 >> 0x20);
    auVar7._12_4_ = (int)(short)((ulong)uVar1 >> 0x30);
    auVar8._0_4_ = (int)(short)pvVar2;
    auVar8._4_4_ = (int)(short)((ulong)pvVar2 >> 0x10);
    auVar8._8_4_ = (int)(short)((ulong)pvVar2 >> 0x20);
    auVar8._12_4_ = (int)(short)((ulong)pvVar2 >> 0x30);
    sVar6 = (secp256k1_callback)packssdw(auVar7,auVar8);
    *error_callback = sVar6;
    auVar7 = ZEXT416((uint)((long)pvVar2 >> 0x3f));
    auVar7 = pshuflw(auVar7,auVar7,0);
    uVar5 = auVar7._0_4_;
    *(undefined4 *)&error_callback[1].fn = uVar5;
    *(undefined4 *)((long)&error_callback[1].fn + 4) = uVar5;
    *(undefined4 *)&error_callback[1].data = uVar5;
    *(undefined4 *)((long)&error_callback[1].data + 4) = uVar5;
    return;
  }
  scratch->magic[0] = '\0';
  scratch->magic[1] = '\0';
  scratch->magic[2] = '\0';
  scratch->magic[3] = '\0';
  scratch->magic[4] = '\0';
  scratch->magic[5] = '\0';
  scratch->magic[6] = '\0';
  scratch->magic[7] = '\0';
  free(scratch);
  return;
}

Assistant:

static void secp256k1_scratch_destroy(const secp256k1_callback* error_callback, secp256k1_scratch* scratch) {
    if (scratch != NULL) {
        if (secp256k1_memcmp_var(scratch->magic, "scratch", 8) != 0) {
            secp256k1_callback_call(error_callback, "invalid scratch space");
            return;
        }
        VERIFY_CHECK(scratch->alloc_size == 0); /* all checkpoints should be applied */
        memset(scratch->magic, 0, sizeof(scratch->magic));
        free(scratch);
    }
}